

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O0

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  UInt UVar3;
  ArrayIndex AVar4;
  char *pcVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Value *pVVar8;
  const_iterator cVar9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  string local_b20;
  basic_string_view<char,_std::char_traits<char>_> local_b00;
  basic_string_view<char,_std::char_traits<char>_> local_af0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_ae0;
  basic_string_view<char,_std::char_traits<char>_> local_ad0;
  basic_string_view<char,_std::char_traits<char>_> local_ac0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_ab0;
  basic_string_view<char,_std::char_traits<char>_> local_aa0;
  basic_string_view<char,_std::char_traits<char>_> local_a90;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a80;
  undefined1 local_a70 [8];
  string lookup_method_str;
  Value *lookup_method;
  char local_a01;
  string local_a00;
  string local_9e0;
  Value *local_9c0;
  Value *source_path_1;
  Value *local_998;
  Value *unique_on_source_path_1;
  string local_988;
  string local_968;
  Value *local_948;
  Value *compiled_module_path_1;
  Value *local_920;
  Value *logical_name_1;
  cmSourceReqInfo require_info;
  Value *require;
  undefined1 local_898 [8];
  const_iterator __end4_1;
  undefined1 local_878 [8];
  const_iterator __begin4_1;
  Value *__range4_1;
  Value *local_840;
  Value *reqs;
  Value *local_818;
  Value *is_interface;
  char local_7e9;
  string local_7e8;
  string local_7c8;
  Value *local_7a8;
  Value *source_path;
  Value *local_780;
  Value *unique_on_source_path;
  string local_770;
  string local_750;
  Value *local_730;
  Value *compiled_module_path;
  Value *local_708;
  Value *logical_name;
  cmSourceReqInfo provide_info;
  Value *provide;
  undefined1 local_680 [8];
  const_iterator __end4;
  undefined1 local_660 [8];
  const_iterator __begin4;
  Value *__range4;
  Value *local_628;
  Value *provides;
  string local_618;
  string local_5f8;
  undefined1 local_5d8 [8];
  string extra_output;
  Value *output;
  undefined1 local_5a0 [8];
  const_iterator __end5;
  undefined1 local_580 [8];
  const_iterator __begin5;
  Value *__range5;
  Value *outputs;
  string local_558;
  string local_538;
  Value *local_518;
  Value *primary_output;
  string local_4f0;
  undefined1 local_4d0 [8];
  string wd;
  Value *workdir;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  Value *rule;
  undefined1 local_468 [8];
  const_iterator __end2;
  undefined1 local_448 [8];
  const_iterator __begin2;
  Value *__range2;
  Value *local_410;
  Value *rules;
  string local_3e8;
  Value *local_3c8;
  Value *version;
  String local_3b8;
  string local_398;
  undefined1 local_378 [8];
  Reader reader;
  undefined1 local_258 [8];
  ifstream ppf;
  Value *ppi;
  Value ppio;
  cmScanDepInfo *info_local;
  string *arg_pp_local;
  
  ppio.limit_ = (ptrdiff_t)info;
  Json::Value::Value((Value *)&ppi,nullValue);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_258,pcVar5,_Var2);
  Json::Reader::Reader((Reader *)local_378);
  bVar1 = Json::Reader::parse((Reader *)local_378,(istream *)local_258,(Value *)&ppi,false);
  if (!bVar1) {
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_3b8,(Reader *)local_378);
    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,std::__cxx11::string>
              (&local_398,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,&local_3b8)
    ;
    cmSystemTools::Error(&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    arg_pp_local._7_1_ = 0;
  }
  version._4_4_ = (uint)!bVar1;
  Json::Reader::~Reader((Reader *)local_378);
  if (version._4_4_ == 0) {
    local_3c8 = Json::Value::operator[]((Value *)&ppi,"version");
    UVar3 = Json::Value::asUInt(local_3c8);
    if (UVar3 < 2) {
      local_410 = Json::Value::operator[]((Value *)&ppi,"rules");
      bVar1 = Json::Value::isArray(local_410);
      if (bVar1) {
        AVar4 = Json::Value::size(local_410);
        if (AVar4 != 1) {
          cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[26]>
                    ((string *)&__range2,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                     arg_pp,(char (*) [26])": expected 1 source entry");
          cmSystemTools::Error((string *)&__range2);
          std::__cxx11::string::~string((string *)&__range2);
          arg_pp_local._7_1_ = 0;
          version._4_4_ = 1;
          goto LAB_00b1a676;
        }
        __begin2.super_ValueIteratorBase._8_8_ = local_410;
        cVar9 = Json::Value::begin(local_410);
        __end2.super_ValueIteratorBase._8_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
        __begin2.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar9.super_ValueIteratorBase.isNull_;
        local_448 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
        cVar9 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
        local_468 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
        __end2.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar9.super_ValueIteratorBase.isNull_;
        while( true ) {
          bVar1 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)local_448,(SelfType *)local_468);
          if (!bVar1) break;
          work_directory.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = Json::ValueConstIterator::operator*((ValueConstIterator *)local_448);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&workdir);
          wd.field_2._8_8_ =
               Json::Value::operator[]
                         ((Value *)work_directory.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._32_8_,"work-directory");
          bVar1 = Json::Value::isString((Value *)wd.field_2._8_8_);
          if (bVar1) {
            std::__cxx11::string::string((string *)local_4d0);
            bVar1 = ParseFilename((Value *)wd.field_2._8_8_,(string *)local_4d0);
            if (bVar1) {
              std::optional<std::__cxx11::string>::operator=
                        ((optional<std::__cxx11::string> *)&workdir,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4d0);
            }
            else {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[15]>
                        (&local_4f0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                         (char (*) [15])": invalid blob");
              cmSystemTools::Error(&local_4f0);
              std::__cxx11::string::~string((string *)&local_4f0);
              arg_pp_local._7_1_ = 0;
            }
            version._4_4_ = (uint)!bVar1;
            std::__cxx11::string::~string((string *)local_4d0);
            if (version._4_4_ == 0) goto LAB_00b18ce8;
          }
          else {
            bVar1 = Json::Value::isNull((Value *)wd.field_2._8_8_);
            if (bVar1) {
LAB_00b18ce8:
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"primary-output");
              if (bVar1) {
                local_518 = Json::Value::operator[]
                                      ((Value *)work_directory.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._32_8_,"primary-output");
                bVar1 = ParseFilename(local_518,(string *)ppio.limit_);
                if (!bVar1) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                            (&local_538,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                             arg_pp,(char (*) [19])": invalid filename");
                  cmSystemTools::Error(&local_538);
                  std::__cxx11::string::~string((string *)&local_538);
                  arg_pp_local._7_1_ = 0;
                  version._4_4_ = 1;
                  goto LAB_00b1a62b;
                }
                bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                if (bVar1) {
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&workdir);
                  uVar6 = std::__cxx11::string::empty();
                  if ((uVar6 & 1) == 0) {
                    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)ppio.limit_);
                    if (!bVar1) {
                      pbVar7 = std::
                               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&workdir);
                      outputs._7_1_ = 0x2f;
                      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                                (&local_558,pbVar7,(char *)((long)&outputs + 7),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)ppio.limit_);
                      std::__cxx11::string::operator=((string *)ppio.limit_,(string *)&local_558);
                      std::__cxx11::string::~string((string *)&local_558);
                    }
                  }
                }
              }
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"outputs");
              if (bVar1) {
                pVVar8 = Json::Value::operator[]
                                   ((Value *)work_directory.
                                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             ._32_8_,"outputs");
                bVar1 = Json::Value::isArray(pVVar8);
                if (bVar1) {
                  __begin5.super_ValueIteratorBase._8_8_ = pVVar8;
                  cVar9 = Json::Value::begin(pVVar8);
                  __end5.super_ValueIteratorBase._8_8_ =
                       cVar9.super_ValueIteratorBase.current_._M_node;
                  __begin5.super_ValueIteratorBase.current_._M_node._0_1_ =
                       cVar9.super_ValueIteratorBase.isNull_;
                  local_580 = (undefined1  [8])__end5.super_ValueIteratorBase._8_8_;
                  cVar9 = Json::Value::end((Value *)__begin5.super_ValueIteratorBase._8_8_);
                  local_5a0 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
                  __end5.super_ValueIteratorBase.current_._M_node._0_1_ =
                       cVar9.super_ValueIteratorBase.isNull_;
                  while( true ) {
                    bVar1 = Json::ValueIteratorBase::operator!=
                                      ((ValueIteratorBase *)local_580,(SelfType *)local_5a0);
                    if (!bVar1) break;
                    extra_output.field_2._8_8_ =
                         Json::ValueConstIterator::operator*((ValueConstIterator *)local_580);
                    std::__cxx11::string::string((string *)local_5d8);
                    bVar1 = ParseFilename((Value *)extra_output.field_2._8_8_,(string *)local_5d8);
                    if (bVar1) {
                      bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                      if (bVar1) {
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&workdir);
                        uVar6 = std::__cxx11::string::empty();
                        if ((uVar6 & 1) == 0) {
                          bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_5d8);
                          if (!bVar1) {
                            pbVar7 = std::
                                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                            provides._7_1_ = 0x2f;
                            cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                                      (&local_618,pbVar7,(char *)((long)&provides + 7),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_5d8);
                            std::__cxx11::string::operator=
                                      ((string *)local_5d8,(string *)&local_618);
                            std::__cxx11::string::~string((string *)&local_618);
                          }
                        }
                      }
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)(ppio.limit_ + 0x20),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5d8);
                      version._4_4_ = 0;
                    }
                    else {
                      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                                (&local_5f8,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                                 arg_pp,(char (*) [19])": invalid filename");
                      cmSystemTools::Error(&local_5f8);
                      std::__cxx11::string::~string((string *)&local_5f8);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                    std::__cxx11::string::~string((string *)local_5d8);
                    if (version._4_4_ != 0) goto LAB_00b1a62b;
                    Json::ValueConstIterator::operator++((ValueConstIterator *)local_580);
                  }
                }
              }
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"provides");
              if (bVar1) {
                local_628 = Json::Value::operator[]
                                      ((Value *)work_directory.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._32_8_,"provides");
                bVar1 = Json::Value::isArray(local_628);
                if (!bVar1) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                            ((string *)&__range4,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [27])": provides is not an array");
                  cmSystemTools::Error((string *)&__range4);
                  std::__cxx11::string::~string((string *)&__range4);
                  arg_pp_local._7_1_ = 0;
                  version._4_4_ = 1;
                  goto LAB_00b1a62b;
                }
                __begin4.super_ValueIteratorBase._8_8_ = local_628;
                cVar9 = Json::Value::begin(local_628);
                __end4.super_ValueIteratorBase._8_8_ =
                     cVar9.super_ValueIteratorBase.current_._M_node;
                __begin4.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar9.super_ValueIteratorBase.isNull_;
                local_660 = (undefined1  [8])__end4.super_ValueIteratorBase._8_8_;
                cVar9 = Json::Value::end((Value *)__begin4.super_ValueIteratorBase._8_8_);
                local_680 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
                __end4.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar9.super_ValueIteratorBase.isNull_;
                while( true ) {
                  bVar1 = Json::ValueIteratorBase::operator!=
                                    ((ValueIteratorBase *)local_660,(SelfType *)local_680);
                  if (!bVar1) break;
                  provide_info._96_8_ =
                       Json::ValueConstIterator::operator*((ValueConstIterator *)local_660);
                  cmSourceReqInfo::cmSourceReqInfo((cmSourceReqInfo *)&logical_name);
                  local_708 = Json::Value::operator[]((Value *)provide_info._96_8_,"logical-name");
                  bVar1 = ParseFilename(local_708,(string *)&logical_name);
                  if (bVar1) {
                    bVar1 = Json::Value::isMember
                                      ((Value *)provide_info._96_8_,"compiled-module-path");
                    if (bVar1) {
                      local_730 = Json::Value::operator[]
                                            ((Value *)provide_info._96_8_,"compiled-module-path");
                      bVar1 = ParseFilename(local_730,
                                            (string *)((long)&provide_info.SourcePath.field_2 + 8));
                      if (!bVar1) {
                        cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                                  (&local_750,
                                   (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                   (char (*) [19])": invalid filename");
                        cmSystemTools::Error(&local_750);
                        std::__cxx11::string::~string((string *)&local_750);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_00b19a43;
                      }
                      bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                      if (bVar1) {
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&workdir);
                        uVar6 = std::__cxx11::string::empty();
                        if ((uVar6 & 1) == 0) {
                          bVar1 = cmsys::SystemTools::FileIsFullPath
                                            ((string *)((long)&provide_info.SourcePath.field_2 + 8))
                          ;
                          if (!bVar1) {
                            pbVar7 = std::
                                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                            unique_on_source_path._7_1_ = 0x2f;
                            cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                                      (&local_770,pbVar7,(char *)((long)&unique_on_source_path + 7),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&provide_info.SourcePath.field_2 + 8));
                            std::__cxx11::string::operator=
                                      ((string *)(provide_info.SourcePath.field_2._M_local_buf + 8),
                                       (string *)&local_770);
                            std::__cxx11::string::~string((string *)&local_770);
                          }
                        }
                      }
                    }
                    bVar1 = Json::Value::isMember
                                      ((Value *)provide_info._96_8_,"unique-on-source-path");
                    if (bVar1) {
                      local_780 = Json::Value::operator[]
                                            ((Value *)provide_info._96_8_,"unique-on-source-path");
                      bVar1 = Json::Value::isBool(local_780);
                      if (!bVar1) {
                        cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[41]>
                                  ((string *)&source_path,
                                   (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                   (char (*) [41])": unique-on-source-path is not a boolean");
                        cmSystemTools::Error((string *)&source_path);
                        std::__cxx11::string::~string((string *)&source_path);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_00b19a43;
                      }
                      provide_info.CompiledModulePath.field_2._M_local_buf[8] =
                           Json::Value::asBool(local_780);
                    }
                    else {
                      provide_info.CompiledModulePath.field_2._M_local_buf[8] = '\0';
                    }
                    bVar1 = Json::Value::isMember((Value *)provide_info._96_8_,"source-path");
                    if (bVar1) {
                      local_7a8 = Json::Value::operator[]
                                            ((Value *)provide_info._96_8_,"source-path");
                      bVar1 = ParseFilename(local_7a8,
                                            (string *)((long)&provide_info.LogicalName.field_2 + 8))
                      ;
                      if (bVar1) {
                        bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                        if (bVar1) {
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&workdir);
                          uVar6 = std::__cxx11::string::empty();
                          if ((uVar6 & 1) == 0) {
                            bVar1 = cmsys::SystemTools::FileIsFullPath
                                              ((string *)
                                               ((long)&provide_info.LogicalName.field_2 + 8));
                            if (!bVar1) {
                              pbVar7 = std::
                                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::operator*((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                              local_7e9 = '/';
                              cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                                        (&local_7e8,pbVar7,&local_7e9,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&provide_info.LogicalName.field_2 + 8));
                              std::__cxx11::string::operator=
                                        ((string *)
                                         (provide_info.LogicalName.field_2._M_local_buf + 8),
                                         (string *)&local_7e8);
                              std::__cxx11::string::~string((string *)&local_7e8);
                            }
                          }
                        }
                        goto LAB_00b1991a;
                      }
                      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                                (&local_7c8,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                                 arg_pp,(char (*) [19])": invalid filename");
                      cmSystemTools::Error(&local_7c8);
                      std::__cxx11::string::~string((string *)&local_7c8);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                    else if ((provide_info.CompiledModulePath.field_2._M_local_buf[8] & 1U) == 0) {
LAB_00b1991a:
                      bVar1 = Json::Value::isMember((Value *)provide_info._96_8_,"is-interface");
                      if (bVar1) {
                        local_818 = Json::Value::operator[]
                                              ((Value *)provide_info._96_8_,"is-interface");
                        bVar1 = Json::Value::isBool(local_818);
                        if (!bVar1) {
                          cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[32]>
                                    ((string *)&reqs,
                                     (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                     (char (*) [32])": is-interface is not a boolean");
                          cmSystemTools::Error((string *)&reqs);
                          std::__cxx11::string::~string((string *)&reqs);
                          arg_pp_local._7_1_ = 0;
                          version._4_4_ = 1;
                          goto LAB_00b19a43;
                        }
                        provide_info.CompiledModulePath.field_2._M_local_buf[9] =
                             Json::Value::asBool(local_818);
                      }
                      else {
                        provide_info.CompiledModulePath.field_2._M_local_buf[9] = '\x01';
                      }
                      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                                ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)
                                 (ppio.limit_ + 0x38),(value_type *)&logical_name);
                      version._4_4_ = 0;
                    }
                    else {
                      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[25]>
                                ((string *)&is_interface,
                                 (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                 (char (*) [25])": source-path is missing");
                      cmSystemTools::Error((string *)&is_interface);
                      std::__cxx11::string::~string((string *)&is_interface);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                  }
                  else {
                    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[15]>
                              ((string *)&compiled_module_path,
                               (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                               (char (*) [15])": invalid blob");
                    cmSystemTools::Error((string *)&compiled_module_path);
                    std::__cxx11::string::~string((string *)&compiled_module_path);
                    arg_pp_local._7_1_ = 0;
                    version._4_4_ = 1;
                  }
LAB_00b19a43:
                  cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&logical_name);
                  if (version._4_4_ != 0) goto LAB_00b1a62b;
                  Json::ValueConstIterator::operator++((ValueConstIterator *)local_660);
                }
              }
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"requires");
              if (bVar1) {
                local_840 = Json::Value::operator[]
                                      ((Value *)work_directory.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._32_8_,"requires");
                bVar1 = Json::Value::isArray(local_840);
                if (!bVar1) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                            ((string *)&__range4_1,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [27])": requires is not an array");
                  cmSystemTools::Error((string *)&__range4_1);
                  std::__cxx11::string::~string((string *)&__range4_1);
                  arg_pp_local._7_1_ = 0;
                  version._4_4_ = 1;
                  goto LAB_00b1a62b;
                }
                __begin4_1.super_ValueIteratorBase._8_8_ = local_840;
                cVar9 = Json::Value::begin(local_840);
                __end4_1.super_ValueIteratorBase._8_8_ =
                     cVar9.super_ValueIteratorBase.current_._M_node;
                __begin4_1.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar9.super_ValueIteratorBase.isNull_;
                local_878 = (undefined1  [8])__end4_1.super_ValueIteratorBase._8_8_;
                cVar9 = Json::Value::end((Value *)__begin4_1.super_ValueIteratorBase._8_8_);
                local_898 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
                __end4_1.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar9.super_ValueIteratorBase.isNull_;
                while( true ) {
                  bVar1 = Json::ValueIteratorBase::operator!=
                                    ((ValueIteratorBase *)local_878,(SelfType *)local_898);
                  if (!bVar1) break;
                  require_info._96_8_ =
                       Json::ValueConstIterator::operator*((ValueConstIterator *)local_878);
                  cmSourceReqInfo::cmSourceReqInfo((cmSourceReqInfo *)&logical_name_1);
                  local_920 = Json::Value::operator[]((Value *)require_info._96_8_,"logical-name");
                  bVar1 = ParseFilename(local_920,(string *)&logical_name_1);
                  if (bVar1) {
                    bVar1 = Json::Value::isMember
                                      ((Value *)require_info._96_8_,"compiled-module-path");
                    if (bVar1) {
                      local_948 = Json::Value::operator[]
                                            ((Value *)require_info._96_8_,"compiled-module-path");
                      bVar1 = ParseFilename(local_948,
                                            (string *)((long)&require_info.SourcePath.field_2 + 8));
                      if (!bVar1) {
                        cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                                  (&local_968,
                                   (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                   (char (*) [19])": invalid filename");
                        cmSystemTools::Error(&local_968);
                        std::__cxx11::string::~string((string *)&local_968);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_00b1a5e4;
                      }
                      bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                      if (bVar1) {
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&workdir);
                        uVar6 = std::__cxx11::string::empty();
                        if ((uVar6 & 1) == 0) {
                          bVar1 = cmsys::SystemTools::FileIsFullPath
                                            ((string *)((long)&require_info.SourcePath.field_2 + 8))
                          ;
                          if (!bVar1) {
                            pbVar7 = std::
                                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                            unique_on_source_path_1._7_1_ = 0x2f;
                            cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                                      (&local_988,pbVar7,
                                       (char *)((long)&unique_on_source_path_1 + 7),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&require_info.SourcePath.field_2 + 8));
                            std::__cxx11::string::operator=
                                      ((string *)(require_info.SourcePath.field_2._M_local_buf + 8),
                                       (string *)&local_988);
                            std::__cxx11::string::~string((string *)&local_988);
                          }
                        }
                      }
                    }
                    bVar1 = Json::Value::isMember
                                      ((Value *)require_info._96_8_,"unique-on-source-path");
                    if (bVar1) {
                      local_998 = Json::Value::operator[]
                                            ((Value *)require_info._96_8_,"unique-on-source-path");
                      bVar1 = Json::Value::isBool(local_998);
                      if (!bVar1) {
                        cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[41]>
                                  ((string *)&source_path_1,
                                   (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                   (char (*) [41])": unique-on-source-path is not a boolean");
                        cmSystemTools::Error((string *)&source_path_1);
                        std::__cxx11::string::~string((string *)&source_path_1);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_00b1a5e4;
                      }
                      require_info.CompiledModulePath.field_2._M_local_buf[8] =
                           Json::Value::asBool(local_998);
                    }
                    else {
                      require_info.CompiledModulePath.field_2._M_local_buf[8] = '\0';
                    }
                    bVar1 = Json::Value::isMember((Value *)require_info._96_8_,"source-path");
                    if (bVar1) {
                      local_9c0 = Json::Value::operator[]
                                            ((Value *)require_info._96_8_,"source-path");
                      bVar1 = ParseFilename(local_9c0,
                                            (string *)((long)&require_info.LogicalName.field_2 + 8))
                      ;
                      if (bVar1) {
                        bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                        if (bVar1) {
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&workdir);
                          uVar6 = std::__cxx11::string::empty();
                          if ((uVar6 & 1) == 0) {
                            bVar1 = cmsys::SystemTools::FileIsFullPath
                                              ((string *)
                                               ((long)&require_info.LogicalName.field_2 + 8));
                            if (!bVar1) {
                              pbVar7 = std::
                                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::operator*((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                              local_a01 = '/';
                              cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                                        (&local_a00,pbVar7,&local_a01,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&require_info.LogicalName.field_2 + 8));
                              std::__cxx11::string::operator=
                                        ((string *)
                                         (require_info.LogicalName.field_2._M_local_buf + 8),
                                         (string *)&local_a00);
                              std::__cxx11::string::~string((string *)&local_a00);
                            }
                          }
                        }
                        goto LAB_00b1a200;
                      }
                      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                                (&local_9e0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                                 arg_pp,(char (*) [19])": invalid filename");
                      cmSystemTools::Error(&local_9e0);
                      std::__cxx11::string::~string((string *)&local_9e0);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                    else if ((require_info.CompiledModulePath.field_2._M_local_buf[8] & 1U) == 0) {
LAB_00b1a200:
                      bVar1 = Json::Value::isMember((Value *)require_info._96_8_,"lookup-method");
                      if (bVar1) {
                        pVVar8 = Json::Value::operator[]
                                           ((Value *)require_info._96_8_,"lookup-method");
                        bVar1 = Json::Value::isString(pVVar8);
                        if (!bVar1) {
                          cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[32]>
                                    ((string *)((long)&lookup_method_str.field_2 + 8),
                                     (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                     (char (*) [32])": lookup-method is not a string");
                          cmSystemTools::Error((string *)((long)&lookup_method_str.field_2 + 8));
                          std::__cxx11::string::~string
                                    ((string *)(lookup_method_str.field_2._M_local_buf + 8));
                          arg_pp_local._7_1_ = 0;
                          version._4_4_ = 1;
                          goto LAB_00b1a5e4;
                        }
                        Json::Value::asString_abi_cxx11_((String *)local_a70,pVVar8);
                        _Var10 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                 std::__cxx11::string::operator_cast_to_basic_string_view
                                           ((string *)local_a70);
                        local_a80 = _Var10;
                        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                                 cm::operator____s("by-name",7);
                        local_aa0 = bVar11;
                        local_a90 = bVar11;
                        bVar1 = std::operator==(local_a80,bVar11);
                        if (bVar1) {
                          require_info.CompiledModulePath.field_2._12_4_ = 0;
LAB_00b1a57d:
                          version._4_4_ = 0;
                        }
                        else {
                          _Var10 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                   std::__cxx11::string::operator_cast_to_basic_string_view
                                             ((string *)local_a70);
                          local_ab0 = _Var10;
                          bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                                   cm::operator____s("include-angle",0xd);
                          local_ad0 = bVar11;
                          local_ac0 = bVar11;
                          bVar1 = std::operator==(local_ab0,bVar11);
                          if (bVar1) {
                            require_info.CompiledModulePath.field_2._12_4_ = 1;
                            goto LAB_00b1a57d;
                          }
                          _Var10 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                   std::__cxx11::string::operator_cast_to_basic_string_view
                                             ((string *)local_a70);
                          local_ae0 = _Var10;
                          bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                                   cm::operator____s("include-quote",0xd);
                          local_b00 = bVar11;
                          local_af0 = bVar11;
                          bVar1 = std::operator==(local_ae0,bVar11);
                          if (bVar1) {
                            require_info.CompiledModulePath.field_2._12_4_ = 2;
                            goto LAB_00b1a57d;
                          }
                          cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33],std::__cxx11::string&>
                                    (&local_b20,
                                     (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                     (char (*) [33])": lookup-method is not a valid: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a70);
                          cmSystemTools::Error(&local_b20);
                          std::__cxx11::string::~string((string *)&local_b20);
                          arg_pp_local._7_1_ = 0;
                          version._4_4_ = 1;
                        }
                        std::__cxx11::string::~string((string *)local_a70);
                        if (version._4_4_ != 0) goto LAB_00b1a5e4;
                      }
                      else if ((require_info.CompiledModulePath.field_2._M_local_buf[8] & 1U) != 0)
                      {
                        require_info.CompiledModulePath.field_2._12_4_ = 0;
                      }
                      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                                ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)
                                 (ppio.limit_ + 0x50),(value_type *)&logical_name_1);
                      version._4_4_ = 0;
                    }
                    else {
                      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[25]>
                                ((string *)&lookup_method,
                                 (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                 (char (*) [25])": source-path is missing");
                      cmSystemTools::Error((string *)&lookup_method);
                      std::__cxx11::string::~string((string *)&lookup_method);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                  }
                  else {
                    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[15]>
                              ((string *)&compiled_module_path_1,
                               (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                               (char (*) [15])": invalid blob");
                    cmSystemTools::Error((string *)&compiled_module_path_1);
                    std::__cxx11::string::~string((string *)&compiled_module_path_1);
                    arg_pp_local._7_1_ = 0;
                    version._4_4_ = 1;
                  }
LAB_00b1a5e4:
                  cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&logical_name_1);
                  if (version._4_4_ != 0) goto LAB_00b1a62b;
                  Json::ValueConstIterator::operator++((ValueConstIterator *)local_878);
                }
              }
              version._4_4_ = 0;
            }
            else {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33]>
                        ((string *)&primary_output,
                         (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                         (char (*) [33])": work-directory is not a string");
              cmSystemTools::Error((string *)&primary_output);
              std::__cxx11::string::~string((string *)&primary_output);
              arg_pp_local._7_1_ = 0;
              version._4_4_ = 1;
            }
          }
LAB_00b1a62b:
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&workdir);
          if (version._4_4_ != 0) goto LAB_00b1a676;
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_448);
        }
      }
      arg_pp_local._7_1_ = 1;
      version._4_4_ = 1;
    }
    else {
      Json::Value::asString_abi_cxx11_((String *)&rules,local_3c8);
      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string>
                (&local_3e8,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                 (char (*) [11])": version ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rules);
      cmSystemTools::Error(&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&rules);
      arg_pp_local._7_1_ = 0;
      version._4_4_ = 1;
    }
  }
LAB_00b1a676:
  std::ifstream::~ifstream(local_258);
  Json::Value::~Value((Value *)&ppi);
  return (bool)(arg_pp_local._7_1_ & 1);
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }
    }
  }

  return true;
}